

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
llbuild::core::BuildEngine::removeCancellationDelegate(BuildEngine *this,CancellationDelegate *del)

{
  CancellationDelegate *del_local;
  BuildEngine *this_local;
  
  anon_unknown.dwarf_33c573::BuildEngineImpl::removeCancellationDelegate
            ((BuildEngineImpl *)this->impl,del);
  return;
}

Assistant:

void BuildEngine::removeCancellationDelegate(CancellationDelegate* del) {
  static_cast<BuildEngineImpl*>(impl)->removeCancellationDelegate(del);
}